

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O2

int CfdFreeAddressesMultisigHandle(void *handle,void *addr_multisig_keys_handle)

{
  allocator local_39;
  string local_38;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&local_38,"MultisigAddr",&local_39);
  cfd::capi::FreeBuffer(addr_multisig_keys_handle,&local_38,0x1e50);
  std::__cxx11::string::~string((string *)&local_38);
  return 0;
}

Assistant:

int CfdFreeAddressesMultisigHandle(
    void* handle, void* addr_multisig_keys_handle) {
  try {
    cfd::Initialize();
    FreeBuffer(
        addr_multisig_keys_handle, kPrefixMultisigAddresses,
        sizeof(CfdCapiMultisigAddresses));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}